

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face *aface,
                   FT_Bool test_mac_fonts)

{
  FT_ListNode pFVar1;
  int iVar2;
  short *psVar3;
  bool local_b9;
  FT_Face_Internal internal;
  FT_Bitmap_Size *bsize;
  FT_Size pFStack_a0;
  FT_Int i;
  FT_Size size;
  FT_Parameter *params_1;
  FT_Parameter *pFStack_88;
  FT_Int num_params_1;
  FT_Parameter *params;
  FT_String **ppFStack_78;
  FT_Int num_params;
  FT_Module *limit;
  FT_Module *cur;
  FT_ListNode pFStack_60;
  FT_Bool external_stream;
  FT_ListNode node;
  FT_Face face;
  FT_Stream stream;
  FT_Memory memory;
  FT_Driver driver;
  FT_Error error;
  FT_Bool test_mac_fonts_local;
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Open_Args *args_local;
  FT_Library library_local;
  
  memory = (FT_Memory)0x0;
  stream = (FT_Stream)0x0;
  face = (FT_Face)0x0;
  node = (FT_ListNode)0x0;
  pFStack_60 = (FT_ListNode)0x0;
  if (((aface == (FT_Face *)0x0) && (-1 < face_index)) || (args == (FT_Open_Args *)0x0)) {
    return 6;
  }
  local_b9 = false;
  if ((args->flags & 2) != 0) {
    local_b9 = args->stream != (FT_Stream)0x0;
  }
  cur._7_1_ = local_b9;
  driver._7_1_ = test_mac_fonts;
  _error = aface;
  aface_local = (FT_Face *)face_index;
  face_index_local = (FT_Long)args;
  args_local = (FT_Open_Args *)library;
  driver._0_4_ = FT_Stream_New(library,args,(FT_Stream *)&face);
  if ((uint)driver == 0) {
    stream = *(FT_Stream *)args_local;
    if (((*(uint *)face_index_local & 8) != 0) && (*(long *)(face_index_local + 0x28) != 0)) {
      memory = *(FT_Memory *)(face_index_local + 0x28);
      if ((((((FT_Driver)memory)->root).clazz)->module_flags & 1) == 0) {
        driver._0_4_ = 0x20;
      }
      else {
        params._4_4_ = 0;
        pFStack_88 = (FT_Parameter *)0x0;
        if ((*(uint *)face_index_local & 0x10) != 0) {
          params._4_4_ = *(FT_Int *)(face_index_local + 0x30);
          pFStack_88 = *(FT_Parameter **)(face_index_local + 0x38);
        }
        driver._0_4_ = open_face((FT_Driver)memory,(FT_Stream *)&face,cur._7_1_,(FT_Long)aface_local
                                 ,params._4_4_,pFStack_88,(FT_Face *)&node);
        if ((uint)driver == 0) {
LAB_002d30e6:
          pFStack_60 = (FT_ListNode)ft_mem_alloc((FT_Memory)stream,0x18,(FT_Error *)&driver);
          if ((uint)driver == 0) {
            pFStack_60->data = node;
            FT_List_Add((FT_List)&node[7].next[1].next,pFStack_60);
            if (-1 < (long)aface_local) {
              driver._0_4_ = FT_New_GlyphSlot((FT_Face)node,(FT_GlyphSlot *)0x0);
              if (((uint)driver != 0) ||
                 (driver._0_4_ = FT_New_Size((FT_Face)node,&stack0xffffffffffffff60),
                 (uint)driver != 0)) goto LAB_002d33e6;
              node[6].data = pFStack_a0;
              driver._0_4_ = 0;
            }
            if (((ulong)node->data & 1) != 0) {
              if (*(short *)((long)&node[5].data + 6) < 0) {
                *(short *)((long)&node[5].data + 6) = -*(short *)((long)&node[5].data + 6);
              }
              if (((ulong)node->data & 0x20) == 0) {
                *(undefined2 *)((long)&node[6].prev + 2) = *(undefined2 *)((long)&node[5].data + 6);
              }
            }
            if (((ulong)node->data & 2) != 0) {
              for (bsize._4_4_ = 0; bsize._4_4_ < *(int *)&node[2].next;
                  bsize._4_4_ = bsize._4_4_ + 1) {
                psVar3 = (short *)((long)node[2].data + (long)bsize._4_4_ * 0x20);
                if (*psVar3 < 0) {
                  *psVar3 = -*psVar3;
                }
                if (*(long *)(psVar3 + 8) < 0) {
                  *(long *)(psVar3 + 8) = -*(long *)(psVar3 + 8);
                }
                if (*(long *)(psVar3 + 0xc) < 0) {
                  *(long *)(psVar3 + 0xc) = -*(long *)(psVar3 + 0xc);
                }
                if (((*psVar3 < 0) || (*(long *)(psVar3 + 8) < 0)) || (*(long *)(psVar3 + 0xc) < 0))
                {
                  psVar3[1] = 0;
                  *psVar3 = 0;
                  psVar3[4] = 0;
                  psVar3[5] = 0;
                  psVar3[6] = 0;
                  psVar3[7] = 0;
                  psVar3[8] = 0;
                  psVar3[9] = 0;
                  psVar3[10] = 0;
                  psVar3[0xb] = 0;
                  psVar3[0xc] = 0;
                  psVar3[0xd] = 0;
                  psVar3[0xe] = 0;
                  psVar3[0xf] = 0;
                }
              }
            }
            pFVar1 = node[10].prev;
            pFVar1->prev = (FT_ListNode)0x10000;
            pFVar1->next = (FT_ListNode)0x0;
            pFVar1->data = (void *)0x0;
            pFVar1[1].prev = (FT_ListNode)0x10000;
            pFVar1[1].next = (FT_ListNode)0x0;
            pFVar1[1].data = (void *)0x0;
            *(undefined4 *)&pFVar1[5].prev = 1;
            *(undefined1 *)&pFVar1[4].data = 0xff;
            if (_error != (FT_Face *)0x0) {
              *_error = (FT_Face)node;
              return (uint)driver;
            }
            FT_Done_Face((FT_Face)node);
            return (uint)driver;
          }
          goto LAB_002d33e6;
        }
      }
      FT_Stream_Free((FT_Stream)face,(uint)cur._7_1_);
      goto LAB_002d33e6;
    }
    driver._0_4_ = 0xb;
    limit = (FT_Module *)&args_local->pathname;
    ppFStack_78 = (FT_String **)limit + *(uint *)((long)&args_local->memory_size + 4);
    for (; limit < ppFStack_78; limit = limit + 1) {
      if (((*limit)->clazz->module_flags & 1) != 0) {
        params_1._4_4_ = 0;
        size = (FT_Size)0x0;
        memory = (FT_Memory)*limit;
        if ((*(uint *)face_index_local & 0x10) != 0) {
          params_1._4_4_ = *(FT_Int *)(face_index_local + 0x30);
          size = *(FT_Size *)(face_index_local + 0x38);
        }
        driver._0_4_ = open_face((FT_Driver)memory,(FT_Stream *)&face,cur._7_1_,(FT_Long)aface_local
                                 ,params_1._4_4_,(FT_Parameter *)size,(FT_Face *)&node);
        if ((uint)driver == 0) goto LAB_002d30e6;
        if (((driver._7_1_ != '\0') &&
            (iVar2 = strcmp((*limit)->clazz->module_name,"truetype"), iVar2 == 0)) &&
           (((uint)driver & 0xff) == 0x8e)) {
          driver._0_4_ = FT_Stream_Seek((FT_Stream)face,0);
          if ((uint)driver != 0) break;
          driver._0_4_ = open_face_PS_from_sfnt_stream
                                   ((FT_Library)args_local,(FT_Stream)face,(FT_Long)aface_local,
                                    params_1._4_4_,(FT_Parameter *)size,_error);
          if ((uint)driver == 0) {
            FT_Stream_Free((FT_Stream)face,(uint)cur._7_1_);
            return (uint)driver;
          }
        }
        if (((uint)driver & 0xff) != 2) break;
      }
    }
  }
  if (((((uint)driver & 0xff) == 0x51) || (((uint)driver & 0xff) == 2)) ||
     (((uint)driver & 0xff) == 0x55)) {
    if ((driver._7_1_ != '\0') &&
       (driver._0_4_ = load_mac_face((FT_Library)args_local,(FT_Stream)face,(FT_Long)aface_local,
                                     _error,(FT_Open_Args *)face_index_local), (uint)driver == 0)) {
      FT_Stream_Free((FT_Stream)face,(uint)cur._7_1_);
      return (uint)driver;
    }
    if (((uint)driver & 0xff) == 2) {
      driver._0_4_ = 2;
    }
  }
  FT_Stream_Free((FT_Stream)face,(uint)cur._7_1_);
LAB_002d33e6:
  if (pFStack_60 == (FT_ListNode)0x0) {
    if (node != (FT_ListNode)0x0) {
      destroy_face((FT_Memory)stream,(FT_Face)node,(FT_Driver)memory);
    }
  }
  else {
    FT_Done_Face((FT_Face)node);
  }
  return (uint)driver;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }